

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

int __thiscall QCompleterPrivate::init(QCompleterPrivate *this,EVP_PKEY_CTX *ctx)

{
  QObject *parent;
  QCompletionModel *this_00;
  long in_FS_OFFSET;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  parent = *(QObject **)&this->field_0x8;
  this_00 = (QCompletionModel *)operator_new(0x28);
  QCompletionModel::QCompletionModel(this_00,this,parent);
  this->proxy = this_00;
  QObject::connect(local_30,(char *)this_00,(QObject *)"2rowsAdded()",(char *)parent,0x70637e);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  QCompleter::setModel((QCompleter *)parent,(QAbstractItemModel *)ctx);
  QCompleter::setCompletionMode((QCompleter *)parent,PopupCompletion);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QCompleterPrivate::init(QAbstractItemModel *m)
{
    Q_Q(QCompleter);
    proxy = new QCompletionModel(this, q);
    QObject::connect(proxy, SIGNAL(rowsAdded()), q, SLOT(_q_autoResizePopup()));
    q->setModel(m);
#if !QT_CONFIG(listview)
    q->setCompletionMode(QCompleter::InlineCompletion);
#else
    q->setCompletionMode(QCompleter::PopupCompletion);
#endif // QT_CONFIG(listview)
}